

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  int iVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  int iVar18;
  size_t itime;
  ulong uVar19;
  long lVar20;
  unsigned_long uVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar29;
  undefined1 auVar28 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [64];
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  ulong local_218;
  size_t local_1f0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  anon_class_16_2_07cfa4d6 local_140;
  ulong local_130;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar17;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar21 = r->_begin;
  local_198 = SUB6416(ZEXT464(0x3f800000),0);
  auVar36 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_1c8._8_4_ = 0x7f800000;
  local_1c8._0_8_ = 0x7f8000007f800000;
  local_1c8._12_4_ = 0x7f800000;
  auVar43 = ZEXT1664(local_1c8);
  local_1a8._8_4_ = 0xff800000;
  local_1a8._0_8_ = 0xff800000ff800000;
  local_1a8._12_4_ = 0xff800000;
  auVar38 = ZEXT1664(local_1a8);
  local_218 = 0;
  auVar47 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar49 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar48 = ZEXT1664(local_1a8);
  auVar50 = ZEXT1664(local_1c8);
  local_1b8 = ZEXT816(0);
  local_1f0 = k;
  while( true ) {
    if (r->_end <= uVar21) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1c8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1c8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_1a8._8_8_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar50._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar48._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar43._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar38._0_16_;
      (__return_storage_ptr__->object_range)._end = local_1b8._0_8_;
      __return_storage_ptr__->num_time_segments = local_1b8._8_8_;
      __return_storage_ptr__->max_num_time_segments = local_218;
      auVar32 = vunpcklpd_avx(auVar36._0_16_,local_198);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar32._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar32._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar32._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar32._8_8_ = 0;
    auVar32._0_4_ = BVar2.lower;
    auVar32._4_4_ = BVar2.upper;
    auVar32 = vmovshdup_avx(auVar32);
    fVar22 = BVar2.lower;
    fVar23 = auVar32._0_4_ - fVar22;
    uVar15 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.field_0x68 * uVar21);
    uVar17 = (ulong)(uVar15 + 1);
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    if (uVar17 < (pBVar3->super_RawBufferView).num) break;
LAB_00bc7c2f:
    uVar21 = uVar21 + 1;
  }
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar32 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar22) / fVar23) * 0.99999976));
  auVar32 = vroundss_avx(auVar32,auVar32,10);
  auVar25 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
  fVar27 = (t0t1->lower - fVar22) / fVar23;
  auVar32 = ZEXT416((uint)(fVar1 * fVar27 * 1.0000002));
  auVar32 = vroundss_avx(auVar32,auVar32,9);
  auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,auVar32);
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  lVar20 = (long)(int)auVar32._0_4_ * 0x38 + 0x10;
  uVar19 = (long)(int)auVar32._0_4_ - 1;
LAB_00bc7820:
  uVar19 = uVar19 + 1;
  if ((ulong)(long)(int)auVar25._0_4_ < uVar19) {
    local_140.primID = &local_130;
    fVar23 = (t0t1->upper - fVar22) / fVar23;
    fVar22 = fVar1 * fVar27;
    fVar29 = fVar1 * fVar23;
    auVar28 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),9);
    auVar30 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),10);
    auVar32 = vmaxss_avx(auVar28,ZEXT816(0));
    auVar25 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
    iVar18 = (int)auVar32._0_4_;
    fVar26 = auVar25._0_4_;
    uVar16 = (uint)auVar28._0_4_;
    uVar17 = (ulong)uVar16;
    uVar15 = 0xffffffff;
    if (-1 < (int)uVar16) {
      uVar15 = uVar16;
    }
    iVar13 = (int)fVar1 + 1;
    if ((int)auVar30._0_4_ < (int)fVar1 + 1) {
      iVar13 = (int)auVar30._0_4_;
    }
    local_140.this = this;
    local_130 = uVar21;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_140,(long)iVar18);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_140,(long)(int)fVar26);
    fVar22 = fVar22 - auVar32._0_4_;
    if (iVar13 - uVar15 == 1) {
      auVar32 = vmaxss_avx(ZEXT416((uint)fVar22),ZEXT816(0) << 0x40);
      auVar25 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar42._0_4_ =
           auVar25._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar32._0_4_ * blower0.lower.field_0.m128[0];
      auVar42._4_4_ =
           auVar25._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar32._4_4_ * blower0.lower.field_0.m128[1];
      auVar42._8_4_ =
           auVar25._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar32._8_4_ * blower0.lower.field_0.m128[2];
      auVar42._12_4_ =
           auVar25._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar32._12_4_ * blower0.lower.field_0.m128[3];
      auVar37._0_4_ =
           auVar25._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar32._0_4_ * blower0.upper.field_0.m128[0];
      auVar37._4_4_ =
           auVar25._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar32._4_4_ * blower0.upper.field_0.m128[1];
      auVar37._8_4_ =
           auVar25._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar32._8_4_ * blower0.upper.field_0.m128[2];
      auVar37._12_4_ =
           auVar25._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar32._12_4_ * blower0.upper.field_0.m128[3];
      auVar32 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar29)),ZEXT816(0) << 0x40);
      auVar25 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar28._0_4_ =
           auVar32._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar25._0_4_ * blower0.lower.field_0.m128[0];
      auVar28._4_4_ =
           auVar32._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar25._4_4_ * blower0.lower.field_0.m128[1];
      auVar28._8_4_ =
           auVar32._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar25._8_4_ * blower0.lower.field_0.m128[2];
      auVar28._12_4_ =
           auVar32._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar25._12_4_ * blower0.lower.field_0.m128[3];
      auVar30._0_4_ =
           auVar32._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar25._0_4_ * blower0.upper.field_0.m128[0];
      auVar30._4_4_ =
           auVar32._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar25._4_4_ * blower0.upper.field_0.m128[1];
      auVar30._8_4_ =
           auVar32._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar25._8_4_ * blower0.upper.field_0.m128[2];
      auVar30._12_4_ =
           auVar32._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar25._12_4_ * blower0.upper.field_0.m128[3];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_140,(long)(iVar18 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_140,(long)((int)fVar26 + -1));
      auVar32 = vmaxss_avx(ZEXT416((uint)fVar22),ZEXT816(0) << 0x40);
      auVar25 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar42._0_4_ =
           auVar25._0_4_ * blower1.lower.field_0.m128[0] +
           auVar32._0_4_ * blower0.lower.field_0.m128[0];
      auVar42._4_4_ =
           auVar25._4_4_ * blower1.lower.field_0.m128[1] +
           auVar32._4_4_ * blower0.lower.field_0.m128[1];
      auVar42._8_4_ =
           auVar25._8_4_ * blower1.lower.field_0.m128[2] +
           auVar32._8_4_ * blower0.lower.field_0.m128[2];
      auVar42._12_4_ =
           auVar25._12_4_ * blower1.lower.field_0.m128[3] +
           auVar32._12_4_ * blower0.lower.field_0.m128[3];
      auVar37._0_4_ =
           auVar25._0_4_ * blower1.upper.field_0.m128[0] +
           auVar32._0_4_ * blower0.upper.field_0.m128[0];
      auVar37._4_4_ =
           auVar25._4_4_ * blower1.upper.field_0.m128[1] +
           auVar32._4_4_ * blower0.upper.field_0.m128[1];
      auVar37._8_4_ =
           auVar25._8_4_ * blower1.upper.field_0.m128[2] +
           auVar32._8_4_ * blower0.upper.field_0.m128[2];
      auVar37._12_4_ =
           auVar25._12_4_ * blower1.upper.field_0.m128[3] +
           auVar32._12_4_ * blower0.upper.field_0.m128[3];
      auVar32 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar29)),ZEXT816(0) << 0x40);
      auVar25 = vshufps_avx(auVar32,auVar32,0);
      auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar28._0_4_ =
           auVar25._0_4_ * bupper0.lower.field_0.m128[0] +
           auVar32._0_4_ * bupper1.lower.field_0.m128[0];
      auVar28._4_4_ =
           auVar25._4_4_ * bupper0.lower.field_0.m128[1] +
           auVar32._4_4_ * bupper1.lower.field_0.m128[1];
      auVar28._8_4_ =
           auVar25._8_4_ * bupper0.lower.field_0.m128[2] +
           auVar32._8_4_ * bupper1.lower.field_0.m128[2];
      auVar28._12_4_ =
           auVar25._12_4_ * bupper0.lower.field_0.m128[3] +
           auVar32._12_4_ * bupper1.lower.field_0.m128[3];
      auVar30._0_4_ =
           auVar25._0_4_ * bupper0.upper.field_0.m128[0] +
           auVar32._0_4_ * bupper1.upper.field_0.m128[0];
      auVar30._4_4_ =
           auVar25._4_4_ * bupper0.upper.field_0.m128[1] +
           auVar32._4_4_ * bupper1.upper.field_0.m128[1];
      auVar30._8_4_ =
           auVar25._8_4_ * bupper0.upper.field_0.m128[2] +
           auVar32._8_4_ * bupper1.upper.field_0.m128[2];
      auVar30._12_4_ =
           auVar25._12_4_ * bupper0.upper.field_0.m128[3] +
           auVar32._12_4_ * bupper1.upper.field_0.m128[3];
      uVar17 = 0xffffffffffffffff;
      if ((int)uVar16 < 0) {
        uVar16 = 0xffffffff;
      }
      itime = (size_t)(int)uVar16;
      while (itime = itime + 1, (long)itime < (long)iVar13) {
        auVar25._0_4_ = ((float)(int)itime / fVar1 - fVar27) / (fVar23 - fVar27);
        auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar32 = vshufps_avx(auVar25,auVar25,0);
        fVar22 = auVar28._4_4_;
        fVar29 = auVar28._8_4_;
        fVar26 = auVar28._12_4_;
        auVar25 = vshufps_avx(ZEXT416((uint)(1.0 - auVar25._0_4_)),
                              ZEXT416((uint)(1.0 - auVar25._0_4_)),0);
        fVar44 = auVar42._4_4_;
        fVar45 = auVar42._8_4_;
        fVar46 = auVar42._12_4_;
        fVar33 = auVar30._4_4_;
        fVar34 = auVar30._8_4_;
        fVar35 = auVar30._12_4_;
        fVar39 = auVar37._4_4_;
        fVar40 = auVar37._8_4_;
        fVar41 = auVar37._12_4_;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_140,itime);
        auVar12._4_4_ = fVar22 * auVar32._4_4_ + fVar44 * auVar25._4_4_;
        auVar12._0_4_ = auVar28._0_4_ * auVar32._0_4_ + auVar42._0_4_ * auVar25._0_4_;
        auVar12._8_4_ = fVar29 * auVar32._8_4_ + fVar45 * auVar25._8_4_;
        auVar12._12_4_ = fVar26 * auVar32._12_4_ + fVar46 * auVar25._12_4_;
        auVar12 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar12);
        auVar14._4_4_ = fVar33 * auVar32._4_4_ + fVar39 * auVar25._4_4_;
        auVar14._0_4_ = auVar30._0_4_ * auVar32._0_4_ + auVar37._0_4_ * auVar25._0_4_;
        auVar14._8_4_ = fVar34 * auVar32._8_4_ + fVar40 * auVar25._8_4_;
        auVar14._12_4_ = fVar35 * auVar32._12_4_ + fVar41 * auVar25._12_4_;
        auVar32 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar14);
        auVar25 = vminps_avx(auVar12,ZEXT816(0) << 0x40);
        auVar32 = vmaxps_avx(auVar32,ZEXT816(0) << 0x40);
        auVar42._0_4_ = auVar42._0_4_ + auVar25._0_4_;
        auVar42._4_4_ = fVar44 + auVar25._4_4_;
        auVar42._8_4_ = fVar45 + auVar25._8_4_;
        auVar42._12_4_ = fVar46 + auVar25._12_4_;
        auVar28._0_4_ = auVar28._0_4_ + auVar25._0_4_;
        auVar28._4_4_ = fVar22 + auVar25._4_4_;
        auVar28._8_4_ = fVar29 + auVar25._8_4_;
        auVar28._12_4_ = fVar26 + auVar25._12_4_;
        auVar37._0_4_ = auVar37._0_4_ + auVar32._0_4_;
        auVar37._4_4_ = fVar39 + auVar32._4_4_;
        auVar37._8_4_ = fVar40 + auVar32._8_4_;
        auVar37._12_4_ = fVar41 + auVar32._12_4_;
        auVar30._0_4_ = auVar30._0_4_ + auVar32._0_4_;
        auVar30._4_4_ = fVar33 + auVar32._4_4_;
        auVar30._8_4_ = fVar34 + auVar32._8_4_;
        auVar30._12_4_ = fVar35 + auVar32._12_4_;
      }
    }
    aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar42,ZEXT416(geomID),0x30);
    uVar15 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar19 = (ulong)uVar15;
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar24._8_8_ = 0;
    auVar24._0_4_ = BVar2.lower;
    auVar24._4_4_ = BVar2.upper;
    aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar37,ZEXT416((uint)uVar21),0x30);
    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar28,ZEXT416(uVar15),0x30);
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar30,ZEXT416(uVar15),0x30);
    auVar25 = vcmpps_avx(local_198,auVar24,1);
    auVar28 = vinsertps_avx(local_198,auVar24,0x50);
    auVar32 = vblendps_avx(auVar24,local_198,2);
    local_198 = vblendvps_avx(auVar32,auVar28,auVar25);
    auVar31._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar9.x * 0.5 + aVar11.x * 0.5;
    auVar31._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar9.y * 0.5 + aVar11.y * 0.5;
    auVar31._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar9.z * 0.5 + aVar11.z * 0.5;
    auVar31._12_4_ =
         aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
         aVar9.field_3.w * 0.5 + aVar11.field_3.w * 0.5;
    auVar32 = vminps_avx((undefined1  [16])auVar43._0_16_,auVar31);
    auVar43 = ZEXT1664(auVar32);
    auVar32 = vmaxps_avx((undefined1  [16])auVar38._0_16_,auVar31);
    auVar38 = ZEXT1664(auVar32);
    auVar32 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar17 >> 8),local_218 < uVar19)),0x50);
    auVar32 = vpslld_avx(auVar32,0x1f);
    auVar32 = vblendvps_avx(auVar36._0_16_,auVar24,auVar32);
    auVar36 = ZEXT1664(auVar32);
    auVar32 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar32 = vpinsrq_avx(auVar32,uVar19,1);
    local_1b8 = vpaddq_avx(local_1b8,auVar32);
    if (local_218 <= uVar19) {
      local_218 = uVar19;
    }
    local_1c8 = vminps_avx(local_1c8,(undefined1  [16])aVar8);
    pPVar7 = prims->items;
    pPVar7[local_1f0].lbounds.bounds0.lower.field_0.field_1 = aVar8;
    local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar9);
    pPVar7[local_1f0].lbounds.bounds0.upper.field_0.field_1 = aVar9;
    auVar32 = vminps_avx((undefined1  [16])auVar50._0_16_,(undefined1  [16])aVar10);
    auVar50 = ZEXT1664(auVar32);
    pPVar7[local_1f0].lbounds.bounds1.lower.field_0.field_1 = aVar10;
    auVar32 = vmaxps_avx((undefined1  [16])auVar48._0_16_,(undefined1  [16])aVar11);
    auVar48 = ZEXT1664(auVar32);
    pPVar7[local_1f0].lbounds.bounds1.upper.field_0.field_1 = aVar11;
    pPVar7[local_1f0].time_range = BVar2;
    local_1f0 = local_1f0 + 1;
    auVar47 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar49 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  }
  else {
    lVar5 = *(long *)((long)pBVar3 + lVar20 + -0x10);
    lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar20);
    auVar32 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar15);
    auVar30 = auVar47._0_16_;
    auVar28 = vcmpps_avx(auVar32,auVar30,2);
    auVar37 = auVar49._0_16_;
    auVar32 = vcmpps_avx(auVar32,auVar37,5);
    auVar32 = vorps_avx(auVar28,auVar32);
    if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]) {
      auVar32 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar17);
      auVar28 = vcmpps_avx(auVar32,auVar30,2);
      auVar32 = vcmpps_avx(auVar32,auVar37,5);
      auVar32 = vorps_avx(auVar28,auVar32);
      if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
      {
        lVar5 = *(long *)((long)pBVar4 + lVar20 + -0x10);
        lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar20);
        auVar32 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar15);
        auVar28 = vcmpps_avx(auVar32,auVar30,2);
        auVar32 = vcmpps_avx(auVar32,auVar37,5);
        auVar32 = vorps_avx(auVar28,auVar32);
        if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]
           ) goto code_r0x00bc78b3;
      }
    }
  }
  goto LAB_00bc7c2f;
code_r0x00bc78b3:
  lVar20 = lVar20 + 0x38;
  auVar32 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar17);
  auVar28 = vcmpps_avx(auVar32,auVar30,2);
  auVar32 = vcmpps_avx(auVar32,auVar37,5);
  auVar32 = vorps_avx(auVar28,auVar32);
  if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0')
  goto LAB_00bc7c2f;
  goto LAB_00bc7820;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }